

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateDeclarations
          (ServiceGenerator *this,Printer *printer)

{
  undefined1 *puVar1;
  Printer *pPVar2;
  long *plVar3;
  long lVar4;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  long alStack_210 [4];
  anon_class_1_0_00000001 local_1e9;
  undefined1 local_1e8 [32];
  MaybeInitializedPtr local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  Printer *local_1a8;
  MaybeInitializedPtr local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_1a0.p = &this->vars_;
  alStack_210[2] = 0x28b9a6;
  local_1a8 = printer;
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>,std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>>>
  ::
  emplace_back<google::protobuf::io::Printer::WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>(absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>const*)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
            ((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>,std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>>>
              *)&printer->var_lookups_,(anon_class_8_1_8992cb2a_conflict *)&local_1a0);
  pPVar2 = local_1a8;
  alStack_210[2] = 0x28b9cc;
  local_1c8.p = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"virts","");
  local_1a0.p = local_190;
  if ((undefined1 *)local_1c8.p == &local_1b8) {
    uStack_188 = uStack_1b0;
  }
  else {
    local_1a0.p = local_1c8.p;
  }
  local_198 = local_1c0;
  local_1c0 = 0;
  local_1b8 = 0;
  alStack_210[2] = 0x28ba1e;
  local_1c8.p = &local_1b8;
  local_180 = (undefined8 *)operator_new(0x18);
  *local_180 = this;
  local_180[1] = &local_1a8;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  alStack_210[2] = 0x28ba95;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x53a374);
  local_f0 = 0;
  puVar1 = local_1e8 + 0x10;
  alStack_210[2] = 0x28bac3;
  local_1e8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"impls","");
  local_e8 = local_d8;
  if ((undefined1 *)local_1e8._0_8_ == puVar1) {
    uStack_d0 = local_1e8._24_8_;
  }
  else {
    local_e8 = (undefined1 *)local_1e8._0_8_;
  }
  local_e0 = local_1e8._8_8_;
  local_1e8._8_8_ = 0;
  local_1e8[0x10] = 0;
  alStack_210[2] = 0x28bb21;
  local_1e8._0_8_ = puVar1;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = this;
  local_c8[1] = &local_1a8;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  uStack_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  alStack_210[2] = 0x28bb97;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x53a374);
  local_38 = 0;
  alStack_210[2] = 0x28bbbc;
  io::Printer::Emit(pPVar2,&local_1a0,2,0x85b,
                    "\n        class $classname$_Stub;\n        class $dllexport_decl $$classname$ : public $pb$::Service {\n         protected:\n          $classname$() = default;\n\n         public:\n          using Stub = $classname$_Stub;\n\n          $classname$(const $classname$&) = delete;\n          $classname$& operator=(const $classname$&) = delete;\n          virtual ~$classname$() = default;\n\n          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();\n\n          $virts$;\n\n          // implements Service ----------------------------------------------\n          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;\n\n          void CallMethod(\n              //~\n              const $pb$::MethodDescriptor* $nonnull$ method,\n              $pb$::RpcController* $nullable$ controller,\n              const $pb$::Message* $nonnull$ request,\n              $pb$::Message* $nonnull$ response,\n              ::google::protobuf::Closure* $nullable$ done) override;\n\n          const $pb$::Message& GetRequestPrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n\n          const $pb$::Message& GetResponsePrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n        };\n\n        class $dllexport_decl $$classname$_Stub final : public $classname$ {\n         public:\n          //~ It seems like channel should be nonnull, but some tests use\n          //~ nullptr. TODO: clean up and switch to nonnull.\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,\n                           $pb$::Service::ChannelOwnership ownership);\n\n          $classname$_Stub(const $classname$_Stub&) = delete;\n          $classname$_Stub& operator=(const $classname$_Stub&) = delete;\n\n          ~$classname$_Stub() override;\n\n          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }\n\n          // implements $classname$ ------------------------------------------\n          $impls$;\n\n         private:\n     ..." /* TRUNCATED STRING LITERAL */
                   );
  lVar4 = 0x170;
  do {
    if ((&local_1b8)[lVar4 + 0x10] == '\x01') {
      alStack_210[2] = 0x28bbe3;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_1e8 + lVar4));
    }
    plVar3 = (long *)((long)alStack_210 + lVar4 + 0x10);
    if (plVar3 != *(long **)((long)alStack_210 + lVar4)) {
      alStack_210[2] = 0x28bbff;
      operator_delete(*(long **)((long)alStack_210 + lVar4),*plVar3 + 1);
    }
    alStack_210[2] = 0x28bc13;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)alStack_210 + lVar4 + -8)]._M_data)
              (&local_1e9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&vStack_238.
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          .
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  + lVar4));
    plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
    *(undefined1 *)((long)alStack_210 + lVar4 + -8) = 0xff;
    if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
      alStack_210[2] = 0x28bc33;
      operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    alStack_210[2] = 0x28bc58;
    operator_delete((void *)local_1e8._0_8_,CONCAT71(local_1e8._17_7_,local_1e8[0x10]) + 1);
  }
  if ((undefined1 *)local_1c8.p != &local_1b8) {
    alStack_210[2] = 0x28bc74;
    operator_delete(local_1c8.p,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  alStack_210[2] = 0x28bc7c;
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::pop_back(&printer->var_lookups_);
  return;
}

Assistant:

void ServiceGenerator::GenerateDeclarations(io::Printer* printer) {
  auto vars = printer->WithVars(&vars_);
  printer->Emit(
      {
          {"virts", [&] { GenerateMethodSignatures(kVirtual, printer); }},
          {"impls", [&] { GenerateMethodSignatures(kNonVirtual, printer); }},
      },
      R"cc(
        class $classname$_Stub;
        class $dllexport_decl $$classname$ : public $pb$::Service {
         protected:
          $classname$() = default;

         public:
          using Stub = $classname$_Stub;

          $classname$(const $classname$&) = delete;
          $classname$& operator=(const $classname$&) = delete;
          virtual ~$classname$() = default;

          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();

          $virts$;

          // implements Service ----------------------------------------------
          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;

          void CallMethod(
              //~
              const $pb$::MethodDescriptor* $nonnull$ method,
              $pb$::RpcController* $nullable$ controller,
              const $pb$::Message* $nonnull$ request,
              $pb$::Message* $nonnull$ response,
              ::google::protobuf::Closure* $nullable$ done) override;

          const $pb$::Message& GetRequestPrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;

          const $pb$::Message& GetResponsePrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;
        };

        class $dllexport_decl $$classname$_Stub final : public $classname$ {
         public:
          //~ It seems like channel should be nonnull, but some tests use
          //~ nullptr. TODO: clean up and switch to nonnull.
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,
                           $pb$::Service::ChannelOwnership ownership);

          $classname$_Stub(const $classname$_Stub&) = delete;
          $classname$_Stub& operator=(const $classname$_Stub&) = delete;

          ~$classname$_Stub() override;

          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }

          // implements $classname$ ------------------------------------------
          $impls$;

         private:
          $pb$::RpcChannel* $nullable$ channel_;
          bool owns_channel_;
        };
      )cc");
}